

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPTCPTransmitter::ClearDestinations(RTPTCPTransmitter *this)

{
  if ((this->m_init == true) && (this->m_created == true)) {
    ClearDestSockets(this);
    return;
  }
  return;
}

Assistant:

void RTPTCPTransmitter::ClearDestinations()
{
	if (!m_init)
		return;
	
	MAINMUTEX_LOCK
	if (m_created)
		ClearDestSockets();
	MAINMUTEX_UNLOCK
}